

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O1

void __thiscall
SLogLib::FileLogger::_WriteMessages
          (FileLogger *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  FileLoggerPriv *pFVar1;
  pointer pbVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *this_00;
  recursive_mutex *__mutex;
  string *_message;
  pointer pbVar6;
  stringstream _stream;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  __mutex = &this->mPriv->mFileWriteMutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    pFVar1 = this->mPriv;
    if (((&pFVar1->field_0x20)[*(long *)(*(long *)pFVar1 + -0x18)] & 5) != 0) {
      std::ofstream::open((char *)pFVar1,(_Ios_Openmode)(pFVar1->mFileName)._M_dataplus._M_p);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') goto LAB_00107593;
    }
    pbVar2 = (messages->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (messages->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this->mPriv,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
    }
    if (this->mPriv->mHasAutoFlush != false) {
      FlushDevice(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar4);
LAB_00107593:
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"SLogLib: Unable to open ",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->mPriv->mFileName)._M_dataplus._M_p,
                      (this->mPriv->mFileName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," for writing.",0xd);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FileLogger::_WriteMessages(const std::vector<std::string>& messages)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mFileWriteMutex);
	
	if(!mPriv->mFileHandle)
	{
		mPriv->mFileHandle.open(mPriv->mFileName.c_str());
		if(!mPriv->mFileHandle.is_open())
		{
			std::stringstream _stream;
			_stream << "SLogLib: Unable to open " << mPriv->mFileName << " for writing.";
			throw std::runtime_error(_stream.str());
		}
	}
	
	for(const std::string& _message : messages)
	{
		mPriv->mFileHandle << _message;
	}
	
	if(mPriv->mHasAutoFlush)
	{
		FlushDevice();
	}
}